

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsPendulum_dns.c
# Opt level: O0

int GetSol(void *cvode_mem,N_Vector yy0,sunrealtype rtol,sunrealtype atol,sunrealtype tf,int nout,
          int proj,int projerr,N_Vector yref)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined4 in_R8D;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined4 in_XMM1_Da;
  double in_XMM2_Qa;
  long netf;
  long ncfn;
  long nfeLS;
  long nje;
  long nsetups;
  long nfe;
  long nst;
  sunrealtype g;
  sunrealtype yd;
  sunrealtype xd;
  sunrealtype y;
  sunrealtype x;
  sunrealtype t;
  sunrealtype tout;
  sunrealtype dtout;
  int out;
  int retval;
  sunrealtype *yydata;
  N_Vector yy;
  FILE *FID;
  char outname [100];
  undefined8 in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea0;
  void *in_stack_fffffffffffffea8;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  undefined8 local_f0;
  double local_e8;
  double local_e0;
  int local_d8;
  int local_d4;
  double *local_d0;
  undefined8 local_c8;
  FILE *local_c0;
  char local_b8 [112];
  undefined8 local_48;
  undefined4 local_3c;
  int local_38;
  int local_34;
  double local_30;
  undefined4 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  int local_4;
  
  local_c0 = (FILE *)0x0;
  local_c8 = 0;
  local_d0 = (double *)0x0;
  local_48 = in_R9;
  local_38 = in_ECX;
  local_34 = in_EDX;
  local_30 = in_XMM2_Qa;
  local_20 = in_XMM0_Qa;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_28 = in_XMM1_Da;
  if (in_ECX == 0) {
    local_d4 = CVodeSetProjFrequency(in_RDI,0);
    iVar1 = check_retval(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                         (int)((ulong)in_stack_fffffffffffffe98 >> 0x20));
    if (iVar1 != 0) {
      return 1;
    }
    printf("  NO    ");
  }
  else {
    local_3c = in_R8D;
    printf("  YES   ");
    local_d4 = CVodeSetProjFrequency(local_10,1);
    iVar1 = check_retval(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                         (int)((ulong)in_stack_fffffffffffffe98 >> 0x20));
    if (iVar1 != 0) {
      return 1;
    }
    local_d4 = CVodeSetProjErrEst(local_10,local_3c);
    iVar1 = check_retval(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                         (int)((ulong)in_stack_fffffffffffffe98 >> 0x20));
    if (iVar1 != 0) {
      return 1;
    }
  }
  local_c8 = N_VNew_Serial(4,sunctx);
  N_VScale(0x3ff0000000000000,local_18,local_c8);
  local_d0 = (double *)N_VGetArrayPointer(local_c8);
  local_d4 = CVodeReInit(local_10,local_18);
  iVar1 = check_retval(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                       (int)((ulong)in_stack_fffffffffffffe98 >> 0x20));
  if (iVar1 == 0) {
    local_d4 = CVodeSStolerances(local_20,local_28,local_10);
    iVar1 = check_retval(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                         (int)((ulong)in_stack_fffffffffffffe98 >> 0x20));
    if (iVar1 == 0) {
      if (local_38 == 0) {
        sprintf(local_b8,"cvsPendulum_dns_rtol_%03.2e_atol_%03.2e.txt",local_20,local_28);
      }
      else {
        sprintf(local_b8,"cvsPendulum_dns_rtol_%03.2e_atol_%03.2e_proj.txt",local_20,local_28);
      }
      local_c0 = fopen(local_b8,"w");
      fprintf(local_c0,"%24.16e %24.16e %24.16e %24.16e %24.16e\n");
      local_e8 = local_30 / (double)local_34;
      local_e0 = local_e8;
      for (local_d8 = 0; iVar1 = (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
          local_d8 < local_34; local_d8 = local_d8 + 1) {
        local_d4 = CVodeSetStopTime(local_e8,local_10);
        iVar1 = check_retval(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                             (int)((ulong)in_stack_fffffffffffffe98 >> 0x20));
        if (iVar1 != 0) {
          N_VDestroy_Serial(local_c8);
          fclose(local_c0);
          return local_d4;
        }
        local_d4 = CVode(local_e8,local_10,local_c8,&local_f0,1);
        iVar1 = check_retval(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                             (int)((ulong)in_stack_fffffffffffffe98 >> 0x20));
        if (iVar1 != 0) {
          N_VDestroy_Serial(local_c8);
          fclose(local_c0);
          return local_d4;
        }
        fprintf(local_c0,"%24.16e %24.16e %24.16e %24.16e %24.16e\n",local_f0,SUB84(*local_d0,0),
                local_d0[1],local_d0[2],local_d0[3]);
        if (local_d8 < local_34 + -1) {
          local_e8 = local_e0 + local_e8;
        }
        else {
          local_e8 = local_30;
        }
      }
      fclose(local_c0);
      local_f8 = *local_d0;
      local_100 = local_d0[1];
      local_118 = ABS((local_f8 * local_f8 + local_100 * local_100) - 1.0);
      N_VLinearSum(0x3ff0000000000000,0,local_c8,local_48,local_c8);
      N_VAbs(local_c8,local_c8);
      local_f8 = *local_d0;
      local_100 = local_d0[1];
      local_108 = local_d0[2];
      local_110 = local_d0[3];
      printf("%8.2e  %8.2e  %8.2e  %8.2e  |  %8.2e  |",local_f8,SUB84(local_100,0),local_108,
             local_110,local_118);
      N_VDestroy_Serial(local_c8);
      local_d4 = CVodeGetNumSteps(local_10,&local_120);
      iVar2 = check_retval(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,iVar1);
      if (iVar2 == 0) {
        local_d4 = CVodeGetNumRhsEvals(local_10,&local_128);
        iVar2 = check_retval(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,iVar1);
        if (iVar2 == 0) {
          local_d4 = CVodeGetNumLinSolvSetups(local_10,&local_130);
          iVar2 = check_retval(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,iVar1);
          if (iVar2 == 0) {
            local_d4 = CVodeGetNumErrTestFails(local_10,&local_150);
            iVar2 = check_retval(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,iVar1);
            if (iVar2 == 0) {
              local_d4 = CVodeGetNumNonlinSolvConvFails(local_10,&local_148);
              iVar2 = check_retval(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,iVar1);
              if (iVar2 == 0) {
                local_d4 = CVodeGetNumJacEvals(local_10,&local_138);
                iVar2 = check_retval(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,iVar1);
                if (iVar2 == 0) {
                  local_d4 = CVodeGetNumLinRhsEvals(local_10,&local_140);
                  iVar1 = check_retval(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,iVar1);
                  if (iVar1 == 0) {
                    printf(" %6ld   %6ld+%-4ld     %4ld (%3ld)     |  %3ld  %3ld\n",local_120,
                           local_128,local_140,local_130,local_138,local_148,local_150);
                    local_4 = 0;
                  }
                  else {
                    local_4 = local_d4;
                  }
                }
                else {
                  local_4 = local_d4;
                }
              }
              else {
                local_4 = local_d4;
              }
            }
            else {
              local_4 = local_d4;
            }
          }
          else {
            local_4 = local_d4;
          }
        }
        else {
          local_4 = local_d4;
        }
      }
      else {
        local_4 = local_d4;
      }
    }
    else {
      N_VDestroy_Serial(local_c8);
      local_4 = local_d4;
    }
  }
  else {
    N_VDestroy_Serial(local_c8);
    local_4 = local_d4;
  }
  return local_4;
}

Assistant:

int GetSol(void* cvode_mem, N_Vector yy0, sunrealtype rtol, sunrealtype atol,
           sunrealtype tf, int nout, sunbooleantype proj,
           sunbooleantype projerr, N_Vector yref)
{
  char outname[100];          /* output file name */
  FILE* FID           = NULL; /* output file      */
  N_Vector yy         = NULL; /* solution vector  */
  sunrealtype* yydata = NULL; /* vector data      */

  int retval;         /* reusable return flag */
  int out;            /* output counter       */
  sunrealtype dtout;  /* output frequency     */
  sunrealtype tout;   /* output time          */
  sunrealtype t;      /* return time          */
  sunrealtype x, y;   /* position values      */
  sunrealtype xd, yd; /* velocity values      */
  sunrealtype g;      /* constraint value     */

  /* Integrator stats */
  long int nst, nfe, nsetups, nje, nfeLS, ncfn, netf;

  /* Enable or disable projection */
  if (proj)
  {
    printf("  YES   ");
    retval = CVodeSetProjFrequency(cvode_mem, 1);
    if (check_retval(&retval, "CVodeSetProjFrequency", 1)) { return (1); }

    /* Enable or disable error projection */
    retval = CVodeSetProjErrEst(cvode_mem, projerr);
    if (check_retval(&retval, "CVodeSetProjErrEst", 1)) { return (1); }
  }
  else
  {
    retval = CVodeSetProjFrequency(cvode_mem, 0);
    if (check_retval(&retval, "CVodeSetProjFrequency", 1)) { return (1); }
    printf("  NO    ");
  }

  /* Create vector to store the solution */
  yy = N_VNew_Serial(4, sunctx);

  /* Copy initial condition into solution vector */
  N_VScale(ONE, yy0, yy);

  /* Get pointer to vector data */
  yydata = N_VGetArrayPointer(yy);

  /* Reinitialize CVODES for this run */
  retval = CVodeReInit(cvode_mem, ZERO, yy0);
  if (check_retval(&retval, "CVodeReInit", 1))
  {
    N_VDestroy_Serial(yy);
    return (retval);
  }

  /* Set integration tolerances for this run */
  retval = CVodeSStolerances(cvode_mem, rtol, atol);
  if (check_retval(&retval, "CVodeSStolerances", 1))
  {
    N_VDestroy_Serial(yy);
    return (retval);
  }

  /* Open output file */
  if (proj)
  {
    sprintf(outname,
            "cvsPendulum_dns_rtol_%03.2" ESYM "_atol_%03.2" ESYM "_proj.txt",
            rtol, atol);
  }
  else
  {
    sprintf(outname, "cvsPendulum_dns_rtol_%03.2" ESYM "_atol_%03.2" ESYM ".txt",
            rtol, atol);
  }
  FID = fopen(outname, "w");

  /* Output initial condition */
  fprintf(FID,
          "%24.16" ESYM " %24.16" ESYM " %24.16" ESYM " %24.16" ESYM
          " %24.16" ESYM "\n",
          ZERO, yydata[0], yydata[1], yydata[2], yydata[3]);

  /* Integrate to tf and peridoically output the solution */
  dtout = tf / nout;
  tout  = dtout;

  for (out = 0; out < nout; out++)
  {
    /* Set stop time (do not interpolate output) */
    retval = CVodeSetStopTime(cvode_mem, tout);
    if (check_retval(&retval, "CVodeSetStopTime", 1))
    {
      N_VDestroy_Serial(yy);
      fclose(FID);
      return (retval);
    }

    /* Integrate to tout */
    retval = CVode(cvode_mem, tout, yy, &t, CV_NORMAL);
    if (check_retval(&retval, "CVode", 1))
    {
      N_VDestroy_Serial(yy);
      fclose(FID);
      return (retval);
    }

    /* Write output */
    fprintf(FID,
            "%24.16" ESYM " %24.16" ESYM " %24.16" ESYM " %24.16" ESYM
            " %24.16" ESYM "\n",
            t, yydata[0], yydata[1], yydata[2], yydata[3]);

    /* Update output time */
    if (out < nout - 1) { tout += dtout; }
    else { tout = tf; }
  }

  /* Close output file */
  fclose(FID);

  /* Compute the constraint violation */
  x = yydata[0];
  y = yydata[1];
  g = ABS(x * x + y * y - ONE);

  /* Compute the absolute error compared to the reference solution */
  N_VLinearSum(ONE, yy, -ONE, yref, yy);
  N_VAbs(yy, yy);

  x  = yydata[0];
  y  = yydata[1];
  xd = yydata[2];
  yd = yydata[3];

  /* Output errors */
  printf("%8.2" ESYM "  %8.2" ESYM "  %8.2" ESYM "  %8.2" ESYM "  |  %8.2" ESYM
         "  |",
         x, y, xd, yd, g);

  /* Free solution vector */
  N_VDestroy_Serial(yy);

  /* Get integrator stats */
  retval = CVodeGetNumSteps(cvode_mem, &nst);
  if (check_retval(&retval, "CVodeGetNumSteps", 1)) { return (retval); }

  retval = CVodeGetNumRhsEvals(cvode_mem, &nfe);
  if (check_retval(&retval, "CVodeGetNumFctEvals", 1)) { return (retval); }

  retval = CVodeGetNumLinSolvSetups(cvode_mem, &nsetups);
  if (check_retval(&retval, "CVodeGetNumLinSolvSetups", 1)) { return (retval); }

  retval = CVodeGetNumErrTestFails(cvode_mem, &netf);
  if (check_retval(&retval, "CVodeGetNumErrTestFails", 1)) { return (retval); }

  retval = CVodeGetNumNonlinSolvConvFails(cvode_mem, &ncfn);
  if (check_retval(&retval, "CVodeGetNumNonlinSolvConvFails", 1))
  {
    return (retval);
  }

  retval = CVodeGetNumJacEvals(cvode_mem, &nje);
  if (check_retval(&retval, "CVodeGetNumJacEvals", 1)) { return (retval); }

  retval = CVodeGetNumLinRhsEvals(cvode_mem, &nfeLS);
  if (check_retval(&retval, "CVodeGetNumLinRhsEvals", 1)) { return (retval); }

  /* Output stats */
  printf(" %6ld   %6ld+%-4ld     %4ld (%3ld)     |  %3ld  %3ld\n", nst, nfe,
         nfeLS, nsetups, nje, ncfn, netf);

  return (0);
}